

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void chunk(LexState *ls)

{
  int iVar1;
  bool bVar2;
  int local_14;
  int islast;
  LexState *ls_local;
  
  local_14 = 0;
  enterlevel(ls);
  while( true ) {
    bVar2 = false;
    if (local_14 == 0) {
      iVar1 = block_follow((ls->t).token);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    local_14 = statement(ls);
    testnext(ls,0x3b);
    ls->fs->freereg = (uint)ls->fs->nactvar;
  }
  ls->L->nCcalls = ls->L->nCcalls - 1;
  return;
}

Assistant:

static void chunk (LexState *ls) {
  /* chunk -> { stat [`;'] } */
  int islast = 0;
  enterlevel(ls);
  while (!islast && !block_follow(ls->t.token)) {
    islast = statement(ls);
    testnext(ls, ';');
    lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
               ls->fs->freereg >= ls->fs->nactvar);
    ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  }
  leavelevel(ls);
}